

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

void __thiscall Person::Person(Person *this,string *i,string *n,Address *ad)

{
  int iVar1;
  ostream *poVar2;
  
  this->_vptr_Person = (_func_int **)&PTR_operator__00108d28;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  Address::Address(&this->address);
  std::__cxx11::string::_M_assign((string *)&this->id);
  std::__cxx11::string::_M_assign((string *)&this->name);
  Address::operator=(&this->address,ad);
  iVar1 = (*this->_vptr_Person[1])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"invalid id");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

Person::Person(string i, string n, const Address &ad) {
    id = i;
    name = n;
    address = ad;
    if (!validate()) {
        cout << "invalid id" << endl;
        exit(-1);
    }
}